

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberZ.cpp
# Opt level: O0

void __thiscall
OpenMD::NumberZ::NumberZ
          (NumberZ *this,SimInfo *info,string *filename,string *sele,int nzbins,int axis)

{
  undefined1 uVar1;
  string *in_RCX;
  SimInfo *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R9D;
  SimInfo *in_stack_00000018;
  SelectionEvaluator *in_stack_00000020;
  SimInfo *in_stack_000001c8;
  SelectionManager *in_stack_000001d0;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  int iVar2;
  StaticAnalyser *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  StaticAnalyser *in_stack_ffffffffffffff30;
  SelectionManager *this_00;
  undefined8 *__new_size;
  vector<double,_std::allocator<double>_> *this_01;
  SelectionEvaluator *this_02;
  string *script;
  SelectionEvaluator *in_stack_ffffffffffffff70;
  string local_70 [72];
  undefined4 local_28;
  string *local_20;
  SimInfo *local_10;
  
  local_28 = in_R9D;
  local_20 = in_RCX;
  local_10 = in_RSI;
  StaticAnalyser::StaticAnalyser
            (in_stack_ffffffffffffff30,
             (SimInfo *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             (string *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  *in_RDI = &PTR__NumberZ_0055fad0;
  script = (string *)(in_RDI + 0x1b);
  std::__cxx11::string::string((string *)script,local_20);
  this_02 = (SelectionEvaluator *)(in_RDI + 0x1f);
  SelectionEvaluator::SelectionEvaluator(in_stack_00000020,in_stack_00000018);
  SelectionManager::SelectionManager(in_stack_000001d0,in_stack_000001c8);
  Thermo::Thermo((Thermo *)(in_RDI + 0xe2),local_10);
  this_00 = (SelectionManager *)(in_RDI + 0xe3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x18e92b);
  __new_size = in_RDI + 0xe6;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x18e941);
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xe9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x18e957);
  *(undefined4 *)(in_RDI + 0xec) = local_28;
  std::__cxx11::string::string((string *)(in_RDI + 0xed));
  SelectionEvaluator::loadScriptString(in_stack_ffffffffffffff70,script);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1f));
  if (!(bool)uVar1) {
    in_stack_ffffffffffffff20 = (StaticAnalyser *)(in_RDI + 0xc9);
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              (this_00,(SelectionSet *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
    SelectionSet::~SelectionSet((SelectionSet *)0x18ea04);
  }
  std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)__new_size);
  iVar2 = *(int *)(in_RDI + 0xec);
  if (iVar2 == 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xed),"x");
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xed),"y");
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0xed),"z");
  }
  getPrefix((string *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff28),(char *)in_stack_ffffffffffffff20);
  StaticAnalyser::setOutputName
            (in_stack_ffffffffffffff20,(string *)CONCAT44(iVar2,in_stack_ffffffffffffff18));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  return;
}

Assistant:

NumberZ::NumberZ(SimInfo* info, const std::string& filename,
                   const std::string& sele, int nzbins, int axis) :
      StaticAnalyser(info, filename, nzbins),
      selectionScript_(sele), evaluator_(info), seleMan_(info), thermo_(info),
      axis_(axis) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    numberZ_.resize(nBins_);

    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      break;
    case 1:
      axisLabel_ = "y";
      break;
    case 2:
    default:
      axisLabel_ = "z";
      break;
    }

    setOutputName(getPrefix(filename) + ".NumberZ");
  }